

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

void free_imm_response(void *client_data)

{
  int iVar1;
  
  iVar1 = *client_data;
  if (((iVar1 == 2) || (iVar1 == 1)) || (iVar1 == 0)) {
    if (*(long *)((long)client_data + 0x18) != 0) {
      cod_code_free();
    }
    if (*(long *)((long)client_data + 0x20) != 0) {
      cod_exec_context_free();
    }
  }
  free(client_data);
  return;
}

Assistant:

static void
free_imm_response(void *client_data)
{
    response_instance resp = (response_instance) client_data;
    switch (resp->response_type) {
    case Response_Filter:
    case Response_Router:
	if (resp->u.filter.code) cod_code_free(resp->u.filter.code);
	if (resp->u.filter.ec) cod_exec_context_free(resp->u.filter.ec);
	break;
    case Response_Transform:
	if (resp->u.transform.code) cod_code_free(resp->u.transform.code);
	if (resp->u.transform.ec) cod_exec_context_free(resp->u.transform.ec);
	break;
    default:
	break;
    }
    free(resp);
}